

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlPopOutputCallbacks(void)

{
  int local_c;
  
  if (xmlOutputCallbackInitialized == 0) {
    local_c = -1;
  }
  else if (xmlOutputCallbackNr < 1) {
    local_c = -1;
  }
  else {
    xmlOutputCallbackNr = xmlOutputCallbackNr + -1;
    xmlOutputCallbackTable[xmlOutputCallbackNr].matchcallback = (xmlOutputMatchCallback)0x0;
    xmlOutputCallbackTable[xmlOutputCallbackNr].opencallback = (xmlOutputOpenCallback)0x0;
    xmlOutputCallbackTable[xmlOutputCallbackNr].writecallback = (xmlOutputWriteCallback)0x0;
    xmlOutputCallbackTable[xmlOutputCallbackNr].closecallback = (xmlOutputCloseCallback)0x0;
    local_c = xmlOutputCallbackNr;
  }
  return local_c;
}

Assistant:

int
xmlPopOutputCallbacks(void)
{
    if (!xmlOutputCallbackInitialized)
        return(-1);

    if (xmlOutputCallbackNr <= 0)
        return(-1);

    xmlOutputCallbackNr--;
    xmlOutputCallbackTable[xmlOutputCallbackNr].matchcallback = NULL;
    xmlOutputCallbackTable[xmlOutputCallbackNr].opencallback = NULL;
    xmlOutputCallbackTable[xmlOutputCallbackNr].writecallback = NULL;
    xmlOutputCallbackTable[xmlOutputCallbackNr].closecallback = NULL;

    return(xmlOutputCallbackNr);
}